

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3HasExplicitNulls(Parse *pParse,ExprList *pList)

{
  u8 uVar1;
  int iVar2;
  long lVar3;
  char *pcVar4;
  
  iVar2 = 0;
  if ((pList != (ExprList *)0x0) && (0 < (long)pList->nExpr)) {
    lVar3 = 0;
    while (((&pList->a[0].fg.field_0x1)[lVar3] & 0x20) == 0) {
      lVar3 = lVar3 + 0x18;
      if ((long)pList->nExpr * 0x18 == lVar3) {
        return 0;
      }
    }
    uVar1 = (&pList->a[0].fg.sortFlags)[lVar3];
    pcVar4 = "LAST";
    if (uVar1 == '\x03') {
      pcVar4 = "FIRST";
    }
    if (uVar1 == '\0') {
      pcVar4 = "FIRST";
    }
    sqlite3ErrorMsg(pParse,"unsupported use of NULLS %s",pcVar4);
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3HasExplicitNulls(Parse *pParse, ExprList *pList){
  if( pList ){
    int i;
    for(i=0; i<pList->nExpr; i++){
      if( pList->a[i].fg.bNulls ){
        u8 sf = pList->a[i].fg.sortFlags;
        sqlite3ErrorMsg(pParse, "unsupported use of NULLS %s",
            (sf==0 || sf==3) ? "FIRST" : "LAST"
        );
        return 1;
      }
    }
  }
  return 0;
}